

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O2

void mp::VisitArguments(QuadTerms *lt,function<void_(int)> *argv)

{
  int __args;
  ptr ppVar1;
  long lVar2;
  _Vector_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  local_48;
  ptr local_30;
  size_ty local_28;
  
  ppVar1 = (lt->folded_).
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_data_ptr;
  local_28 = (lt->folded_).
             super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
             m_data.
             super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
             m_size;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30 = ppVar1;
  for (lVar2 = local_28 << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    __args = (ppVar1->first).second;
    std::function<void_(int)>::operator()(argv,(ppVar1->first).first);
    std::function<void_(int)>::operator()(argv,__args);
    ppVar1 = ppVar1 + 1;
  }
  std::
  _Vector_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ::~_Vector_base(&local_48);
  return;
}

Assistant:

void VisitArguments(const QuadTerms& lt, std::function<void (int)> argv) {
  for (auto v: lt.get_folded()) {
    argv(v.first.first);
    argv(v.first.second);
  }
}